

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flasher.cpp
# Opt level: O0

void __thiscall Flasher::lock(Flasher *this,string *regionArg,bool enable)

{
  byte bVar1;
  uint uVar2;
  ulong uVar3;
  pointer pFVar4;
  long lVar5;
  char *pcVar6;
  reference rVar7;
  reference local_f0;
  string local_e0 [32];
  undefined1 local_c0 [8];
  vector<bool,_std::allocator<bool>_> regions_1;
  string sub;
  uint32_t region;
  size_t delim;
  size_t pos;
  allocator<bool> local_49;
  undefined1 local_48 [8];
  vector<bool,_std::allocator<bool>_> regions;
  bool enable_local;
  string *regionArg_local;
  Flasher *this_local;
  
  regions.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage._7_1_ = enable;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::string
              ((string *)
               &regions_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    pFVar4 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
    (*pFVar4->_vptr_Flash[10])(local_c0);
    do {
      lVar5 = std::__cxx11::string::find((char)regionArg,0x2c);
      std::__cxx11::string::substr((ulong)local_e0,(ulong)regionArg);
      std::__cxx11::string::operator=
                ((string *)
                 &regions_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_end_of_storage,local_e0);
      std::__cxx11::string::~string(local_e0);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      uVar3 = strtol(pcVar6,(char **)0x0,0);
      pcVar6 = "Unlock";
      if ((regions.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_end_of_storage._7_1_ & 1) != 0) {
        pcVar6 = "Lock";
      }
      (*this->_observer->_vptr_FlasherObserver[2])
                (this->_observer,"%s region %d\n",pcVar6,uVar3 & 0xffffffff);
      bVar1 = regions.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_end_of_storage._7_1_;
      rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        ((vector<bool,_std::allocator<bool>_> *)local_c0,uVar3 & 0xffffffff);
      local_f0 = rVar7;
      std::_Bit_reference::operator=(&local_f0,(bool)(bVar1 & 1));
    } while (lVar5 != -1);
    pFVar4 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
    (*pFVar4->_vptr_Flash[0xb])(pFVar4,local_c0);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_c0);
    std::__cxx11::string::~string
              ((string *)
               &regions_1.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
  }
  else {
    pcVar6 = "Unlock";
    if ((regions.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
         _M_end_of_storage._7_1_ & 1) != 0) {
      pcVar6 = "Lock";
    }
    (*this->_observer->_vptr_FlasherObserver[2])(this->_observer,"%s all regions\n",pcVar6);
    pFVar4 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
    uVar2 = (*pFVar4->_vptr_Flash[7])();
    std::allocator<bool>::allocator(&local_49);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)local_48,(ulong)uVar2,
               (bool *)((long)&regions.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage + 7),&local_49);
    std::allocator<bool>::~allocator(&local_49);
    pFVar4 = std::unique_ptr<Flash,_std::default_delete<Flash>_>::operator->(this->_flash);
    (*pFVar4->_vptr_Flash[0xb])(pFVar4,local_48);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)local_48);
  }
  return;
}

Assistant:

void
Flasher::lock(string& regionArg, bool enable)
{
    if (regionArg.empty())
    {
        _observer.onStatus("%s all regions\n", enable ? "Lock" : "Unlock");
        std::vector<bool> regions(_flash->lockRegions(), enable);
        _flash->setLockRegions(regions);
    }
    else
    {
        size_t pos = 0;
        size_t delim;
        uint32_t region;
        string sub;
        std::vector<bool> regions = _flash->getLockRegions();

        do
        {
            delim = regionArg.find(',', pos);
            sub = regionArg.substr(pos, delim - pos);
            region = strtol(sub.c_str(), NULL, 0);
            _observer.onStatus("%s region %d\n", enable ? "Lock" : "Unlock", region);
            regions[region] = enable;
            pos = delim + 1;
        } while (delim != string::npos);

        _flash->setLockRegions(regions);
    }
}